

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  pointer ppcVar1;
  cmake *this_00;
  cmDebugger *pcVar2;
  cmListFileContext *pcVar3;
  cmListFileBacktrace local_50;
  
  if (((t & ~AUTHOR_ERROR) == FATAL_ERROR) &&
     (ppcVar1 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     (this->ExecutionStatusStack).
     super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
     super__Vector_impl_data._M_start != ppcVar1)) {
    ppcVar1[-1]->NestedError = true;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  cmListFileBacktrace::cmListFileBacktrace(&local_50,&this->Backtrace);
  cmake::IssueMessage(this_00,t,text,&local_50);
  cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  if (((t & ~AUTHOR_ERROR) == FATAL_ERROR) &&
     (pcVar2 = this->GlobalGenerator->CMakeInstance->Debugger, pcVar2 != (cmDebugger *)0x0)) {
    pcVar3 = cmListFileBacktrace::Top(&this->Backtrace);
    (*pcVar2->_vptr_cmDebugger[0xd])(pcVar2,pcVar3);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text) const
{
  if (!this->ExecutionStatusStack.empty()) {
    if ((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR)) {
      this->ExecutionStatusStack.back()->SetNestedError();
    }
  }
  this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
  if ((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR)) {
    if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
      debugger->ErrorHook(this->Backtrace.Top());
    }
  }
}